

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::visitRefEq(OptimizeInstructions *this,RefEq *curr)

{
  Expression **input;
  Expression **input_00;
  Expression *pEVar1;
  bool bVar2;
  bool bVar3;
  Expression *__tmp;
  HeapType left;
  HeapType right;
  Expression *pEVar4;
  Expression *pEVar5;
  RefIsNull *this_00;
  Literal *this_01;
  Literal local_70;
  Literal local_58;
  Type local_40;
  Type leftType;
  Type rightType;
  
  local_40.id = (curr->left->type).id;
  leftType.id = (curr->right->type).id;
  if (leftType.id != 1 && local_40.id != 1) {
    left = wasm::Type::getHeapType(&local_40);
    right = wasm::Type::getHeapType(&leftType);
    bVar2 = HeapType::isSubType(left,right);
    bVar3 = HeapType::isSubType(right,left);
    if (((bVar2) || (bVar3)) ||
       ((local_40.id < 7 || (local_40.id & 3) != 0 && ((leftType.id & 3) != 0 || leftType.id < 7))))
    {
      input = &curr->left;
      input_00 = &curr->right;
      skipCast(this,input,(Type)0x2a);
      skipCast(this,input_00,(Type)0x2a);
      bVar2 = areConsecutiveInputsEqualAndFoldable(this,*input,*input_00);
      if (!bVar2) {
        pEVar4 = *input;
        pEVar1 = *input_00;
        pEVar5 = pEVar1;
        if (pEVar4->_id == RefNullId) {
          *input = pEVar1;
          *input_00 = pEVar4;
          pEVar5 = pEVar4;
          pEVar4 = pEVar1;
        }
        if (pEVar5->_id != RefNullId) {
          return;
        }
        this_00 = (RefIsNull *)
                  MixedArena::allocSpace
                            (&((this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .currModule)->allocator,0x18,8);
        (this_00->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression._id =
             RefIsNullId;
        (this_00->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression.type.id = 0;
        this_00->value = pEVar4;
        RefIsNull::finalize(this_00);
        replaceCurrent(this,(Expression *)this_00);
        return;
      }
      Literal::makeOne(&local_58,(Type)0x2);
      pEVar4 = getDroppedChildrenAndAppend(this,(Expression *)curr,&local_58);
      replaceCurrent(this,pEVar4);
      this_01 = &local_58;
    }
    else {
      Literal::makeZero(&local_70,(Type)0x2);
      pEVar4 = getDroppedChildrenAndAppend(this,(Expression *)curr,&local_70);
      replaceCurrent(this,pEVar4);
      this_01 = &local_70;
    }
    Literal::~Literal(this_01);
  }
  return;
}

Assistant:

void visitRefEq(RefEq* curr) {
    // The types may prove that the same reference cannot appear on both sides.
    auto leftType = curr->left->type;
    auto rightType = curr->right->type;
    if (leftType == Type::unreachable || rightType == Type::unreachable) {
      // Leave this for DCE.
      return;
    }
    auto leftHeapType = leftType.getHeapType();
    auto rightHeapType = rightType.getHeapType();
    auto leftIsHeapSubtype = HeapType::isSubType(leftHeapType, rightHeapType);
    auto rightIsHeapSubtype = HeapType::isSubType(rightHeapType, leftHeapType);
    if (!leftIsHeapSubtype && !rightIsHeapSubtype &&
        (leftType.isNonNullable() || rightType.isNonNullable())) {
      // The heap types have no intersection, so the only thing that can
      // possibly appear on both sides is null, but one of the two is non-
      // nullable, which rules that out. So there is no way that the same
      // reference can appear on both sides.
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, Literal::makeZero(Type::i32)));
      return;
    }

    // Equality does not depend on the type, so casts may be removable.
    //
    // This is safe to do first because nothing farther down cares about the
    // type, and we consume the two input references, so removing a cast could
    // not help our parents (see "notes on removing casts").
    Type nullableEq = Type(HeapType::eq, Nullable);
    skipCast(curr->left, nullableEq);
    skipCast(curr->right, nullableEq);

    // Identical references compare equal.
    // (Technically we do not need to check if the inputs are also foldable into
    // a single one, but we do not have utility code to handle non-foldable
    // cases yet; the foldable case we do handle is the common one of the first
    // child being a tee and the second a get of that tee. TODO)
    if (areConsecutiveInputsEqualAndFoldable(curr->left, curr->right)) {
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, Literal::makeOne(Type::i32)));
      return;
    }

    // Canonicalize to the pattern of a null on the right-hand side, if there is
    // one. This makes pattern matching simpler.
    if (curr->left->is<RefNull>()) {
      std::swap(curr->left, curr->right);
    }

    // RefEq of a value to Null can be replaced with RefIsNull.
    if (curr->right->is<RefNull>()) {
      replaceCurrent(Builder(*getModule()).makeRefIsNull(curr->left));
    }
  }